

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AstSerialise.cpp
# Opt level: O2

string * __thiscall
enact::AstSerialise::visitCastExpr_abi_cxx11_
          (string *__return_storage_ptr__,AstSerialise *this,CastExpr *expr)

{
  Expr *pEVar1;
  int iVar2;
  undefined4 extraout_var;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  std::operator+(&local_40,"(",&(expr->oper).lexeme);
  std::operator+(&local_c0,&local_40," ");
  pEVar1 = (expr->expr)._M_t.super___uniq_ptr_impl<enact::Expr,_std::default_delete<enact::Expr>_>.
           _M_t.super__Tuple_impl<0UL,_enact::Expr_*,_std::default_delete<enact::Expr>_>.
           super__Head_base<0UL,_enact::Expr_*,_false>._M_head_impl;
  (*pEVar1->_vptr_Expr[2])(&local_e0,pEVar1,&this->field_0x8);
  std::operator+(&local_a0,&local_c0,&local_e0);
  std::operator+(&local_80,&local_a0," ");
  iVar2 = (*((expr->typename_)._M_t.
             super___uniq_ptr_impl<const_enact::Typename,_std::default_delete<const_enact::Typename>_>
             ._M_t.
             super__Tuple_impl<0UL,_const_enact::Typename_*,_std::default_delete<const_enact::Typename>_>
             .super__Head_base<0UL,_const_enact::Typename_*,_false>._M_head_impl)->_vptr_Typename[4]
          )();
  std::operator+(&local_60,&local_80,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(extraout_var,iVar2));
  std::operator+(__return_storage_ptr__,&local_60,")");
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_40);
  return __return_storage_ptr__;
}

Assistant:

std::string AstSerialise::visitCastExpr(CastExpr& expr) {
        return "(" + expr.oper.lexeme + " " + visitExpr(*expr.expr) + " " + expr.typename_->name() + ")";
    }